

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall HSlider::draw(HSlider *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  Theme *pTVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined4 uVar12;
  double dVar11;
  undefined8 uVar13;
  undefined8 uVar14;
  SaveState state;
  
  uVar12 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  pTVar6 = ((this->super_Widget).dialog)->theme;
  iVar8 = (this->super_Widget).y2 + (this->super_Widget).y1;
  al_store_state(&state,0xffff,(long)iVar8 % 2 & 0xffffffff);
  uVar13._0_4_ = (pTVar6->bg).r;
  uVar13._4_4_ = (pTVar6->bg).g;
  uVar14._0_4_ = (pTVar6->bg).b;
  uVar14._4_4_ = (pTVar6->bg).a;
  iVar9 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar9 != '\0') {
    uVar13 = al_map_rgb(0x40,0x40,0x40);
    uVar14 = in_XMM1_Qa;
  }
  al_draw_filled_rectangle
            ((float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
             CONCAT44(uVar12,(float)(this->super_Widget).x2),(float)(this->super_Widget).y2,uVar13,
             uVar14);
  fVar10 = (float)(iVar8 / 2);
  uVar1._0_4_ = (pTVar6->fg).r;
  uVar1._4_4_ = (pTVar6->fg).g;
  uVar2._0_4_ = (pTVar6->fg).b;
  uVar2._4_4_ = (pTVar6->fg).a;
  al_draw_line((float)(this->super_Widget).x1,fVar10,(float)(this->super_Widget).x2,fVar10,uVar1,
               uVar2,0);
  uVar13 = *(undefined8 *)&(this->super_Widget).field_0x34;
  dVar7 = (double)(int)((ulong)uVar13 >> 0x20);
  uVar5 = (this->super_Widget).x1;
  dVar11 = (double)(~uVar5 + (this->super_Widget).x2) * ((double)(int)uVar13 / dVar7);
  iVar8 = (int)dVar11;
  uVar3._0_4_ = (pTVar6->fg).r;
  uVar3._4_4_ = (pTVar6->fg).g;
  uVar4._0_4_ = (pTVar6->fg).b;
  uVar4._4_4_ = (pTVar6->fg).a;
  al_draw_filled_rectangle
            ((float)(int)((uVar5 - 2) + iVar8),
             CONCAT44((int)((ulong)dVar7 >> 0x20),(float)(this->super_Widget).y1),
             CONCAT44((int)((ulong)dVar11 >> 0x20),(float)(int)(uVar5 + 2 + iVar8)),
             (float)(this->super_Widget).y2,uVar3,uVar4);
  anon_unknown.dwarf_9dc6::SaveState::~SaveState(&state);
  return;
}

Assistant:

void HSlider::draw()
{
   const Theme & theme = dialog->get_theme();
   const int cy = (y1 + y2) / 2;
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1, y1, x2, y2, bg);
   al_draw_line(x1, cy, x2, cy, theme.fg, 0);

   double ratio = (double) this->cur_value / (double) this->max_value;
   int xpos = x1 + (int) (ratio * (width() - 2));
   al_draw_filled_rectangle(xpos - 2, y1, xpos + 2, y2, theme.fg);
}